

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_capabilities.cpp
# Opt level: O0

void __thiscall
pfederc::Parser::parseCapabilityEnsure
          (Parser *this,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *requires,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *ensures)

{
  bool bVar1;
  TokenType TVar2;
  Token *pTVar3;
  Position *pos_00;
  Lexer *lexer;
  undefined1 local_70 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  uint8_t local_49;
  Token *pTStack_48;
  uint8_t capstype;
  Token *tokCmd;
  undefined1 local_38 [7];
  bool err;
  Position pos;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  *ensures_local;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  *requires_local;
  Parser *this_local;
  
  pos.endIndex = (size_t)ensures;
  pTVar3 = Lexer::getCurrentToken(this->lexer);
  pos_00 = Token::getPosition(pTVar3);
  Position::Position((Position *)local_38,pos_00);
  sanityExpect(this,TOK_ENSURE);
  tokCmd._7_1_ = 0;
  pTVar3 = Lexer::getCurrentToken(this->lexer);
  local_49 = 0;
  pTStack_48 = pTVar3;
  lexer = getLexer(this);
  local_49 = _getCapsEnsure(pTVar3,lexer);
  if (local_49 == '\0') {
    expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._6_2_ = 2;
    expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._0_4_ = 0x27;
    pTVar3 = Lexer::getCurrentToken(this->lexer);
    Token::getPosition(pTVar3);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&stack0xffffffffffffffa0,
               (SyntaxErrorCode *)
               ((long)&expr._M_t.
                       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 6),
               (Position *)&expr);
    generateError((Parser *)&stack0xffffffffffffffa8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffa8);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&stack0xffffffffffffffa0);
    pTVar3 = Lexer::getCurrentToken(this->lexer);
    TVar2 = Token::getType(pTVar3);
    if ((1 < (ushort)(TVar2 - TOK_EOL)) && (TVar2 != TOK_STMT)) {
      Lexer::next(this->lexer);
    }
    tokCmd._7_1_ = 1;
  }
  else {
    Lexer::next(this->lexer);
  }
  parseExpression((Parser *)local_70,(Precedence)this);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_70);
  if (!bVar1) {
    tokCmd._7_1_ = 1;
  }
  if ((tokCmd._7_1_ & 1) == 0) {
    if (local_49 == '\x01') {
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::push_back((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                   *)pos.endIndex,(value_type *)local_70);
    }
    else {
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::push_back(requires,(value_type *)local_70);
    }
  }
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_70);
  return;
}

Assistant:

void Parser::parseCapabilityEnsure(std::vector<std::unique_ptr<Expr>> &requires,
    std::vector<std::unique_ptr<Expr>> &ensures) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_ENSURE);

  bool err = false;

  const Token *const tokCmd = lexer.getCurrentToken();
  uint8_t capstype = _CAPS_ENSURE_INVALID;
  if ((capstype = _getCapsEnsure(tokCmd, getLexer())) == _CAPS_ENSURE_INVALID) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_ENSURE, lexer.getCurrentToken()->getPosition()));
    switch (lexer.getCurrentToken()->getType()) {
    case TokenType::TOK_EOF:
    case TokenType::TOK_EOL:
    case TokenType::TOK_STMT:
      break;
    default:
      lexer.next();
      break;
    }

    err = true;
  } else {
    lexer.next();
  }

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expr)
    err = true;

  if (err)
    return;

  if (capstype == _CAPS_ENSURE_ENSURES)
    ensures.push_back(std::move(expr));
  else
    requires.push_back(std::move(expr));
}